

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O0

mg_map * mg_map_make_empty(uint32_t capacity)

{
  uint32_t in_EDI;
  mg_map *map;
  mg_map *local_8;
  
  local_8 = mg_map_alloc(capacity,(mg_allocator *)map);
  if (local_8 == (mg_map *)0x0) {
    local_8 = (mg_map *)0x0;
  }
  else {
    local_8->size = 0;
    local_8->capacity = in_EDI;
  }
  return local_8;
}

Assistant:

mg_map *mg_map_make_empty(uint32_t capacity) {
  mg_map *map = mg_map_alloc(capacity, &mg_system_allocator);
  if (!map) {
    return NULL;
  }
  map->size = 0;
  map->capacity = capacity;
  return map;
}